

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp.h
# Opt level: O1

void __thiscall kiste::cpp::escape(cpp *this,char *c)

{
  char cVar1;
  char *pcVar2;
  char local_1;
  
  cVar1 = *c;
  if (cVar1 == '\n') {
    pcVar2 = "\\n";
  }
  else if (cVar1 == '\"') {
    pcVar2 = "\\\"";
  }
  else {
    if (cVar1 != '\\') {
      std::__ostream_insert<char,std::char_traits<char>>(this->_os,&local_1,1);
      return;
    }
    pcVar2 = "\\\\";
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->_os,pcVar2,2);
  return;
}

Assistant:

auto escape(const char& c) -> void
    {
      switch (c)
      {
      case '\\':
        _os << "\\\\";
        break;
      case '"':
        _os << "\\\"";
        break;
      case '\n':
        _os << "\\n";
        break;
      default:
        _os << c;
      }
    }